

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

ppcmas_tlb_t * booke206_cur_tlb(CPUPPCState_conflict2 *env)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  ppcmas_tlb_t *ppVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar7 = (uint)env->spr[0x270];
  uVar6 = uVar7 >> 0x1c & 3;
  if (((uVar7 >> 0xe & 1) != 0) && ((env->spr[(ulong)uVar6 + 0x2b0] & 0x2000) != 0)) {
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,"we don\'t support HES yet\n");
  }
  uVar8 = (uint)env->spr[(ulong)uVar6 + 0x2b0];
  uVar9 = uVar8 >> 0x18;
  cVar5 = '\0';
  bVar2 = 0x20;
  if (uVar9 != 0) {
    iVar1 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
      }
    }
    bVar2 = (byte)iVar1;
  }
  uVar8 = uVar8 & 0xfff;
  if (uVar8 != 0) {
    iVar1 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
      }
    }
    cVar5 = (char)iVar1;
  }
  uVar7 = ((uint)((ulong)(long)(int)env->spr[0x272] >> 0xc) & ~(-1 << (cVar5 - bVar2 & 0x1f))) <<
          (bVar2 & 0x3f) | uVar7 >> 0x10 & 0xfff & uVar9 + 0xfff;
  if ((int)uVar7 < (int)uVar8) {
    if (uVar6 != 0) {
      uVar3 = 0;
      do {
        uVar7 = uVar7 + ((uint)env->spr[uVar3 + 0x2b0] & 0xfff);
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
    }
    ppVar4 = (ppcmas_tlb_t *)((env->tlb).tlb6 + (int)uVar7);
  }
  else {
    ppVar4 = (ppcmas_tlb_t *)0x0;
  }
  return ppVar4;
}

Assistant:

static ppcmas_tlb_t *booke206_cur_tlb(CPUPPCState *env)
{
    uint32_t tlbncfg = 0;
    int esel = (env->spr[SPR_BOOKE_MAS0] & MAS0_ESEL_MASK) >> MAS0_ESEL_SHIFT;
    int ea = (env->spr[SPR_BOOKE_MAS2] & MAS2_EPN_MASK);
    int tlb;

    tlb = (env->spr[SPR_BOOKE_MAS0] & MAS0_TLBSEL_MASK) >> MAS0_TLBSEL_SHIFT;
    tlbncfg = env->spr[SPR_BOOKE_TLB0CFG + tlb];

    if ((tlbncfg & TLBnCFG_HES) && (env->spr[SPR_BOOKE_MAS0] & MAS0_HES)) {
        cpu_abort(env_cpu(env), "we don't support HES yet\n");
    }

    return booke206_get_tlbm(env, tlb, ea, esel);
}